

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateNotCalledWithExecutionModel
          (BuiltInsValidator *this,int vuid,char *comment,ExecutionModel execution_model,
          Decoration *decoration,Instruction *built_in_inst,Instruction *referenced_inst,
          Instruction *referenced_from_inst)

{
  spv_result_t sVar1;
  ValidationState_t *pVVar2;
  BuiltIn operand;
  size_type sVar3;
  char *pcVar4;
  DiagnosticStream *pDVar5;
  Instruction *inst;
  Instruction *inst_00;
  Instruction *inst_01;
  allocator<char> local_2a5;
  ExecutionModel execution_model_local;
  mapped_type *local_2a0;
  char *local_298;
  uint32_t *local_290;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [328];
  _Head_base<3UL,_spv::ExecutionModel,_false> local_c0;
  _Head_base<2UL,_const_char_*,_false> local_b8;
  _Head_base<1UL,_int,_false> local_b0;
  _Head_base<0UL,_spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_false> local_a8;
  
  execution_model_local = execution_model;
  if (this->function_id_ == 0) {
    local_268._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
    local_2a0 = std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](&this->id_to_at_reference_checks_,(key_type_conflict *)&local_268);
    local_208._0_8_ = ValidateNotCalledWithExecutionModel;
    local_208._8_8_ = 0;
    std::
    _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl((_Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                   *)(local_208 + 0x10),decoration,built_in_inst,referenced_from_inst,
                  (_Placeholder<1> *)&std::placeholders::_1);
    local_c0._M_head_impl = execution_model;
    local_b8._M_head_impl = comment;
    local_b0._M_head_impl = vuid;
    local_a8._M_head_impl = this;
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_288,
               (_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
                *)local_208);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(local_2a0,(value_type *)&local_288);
    if ((code *)local_288.field_2._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_288.field_2._M_allocated_capacity)(&local_288,&local_288,3);
    }
    std::
    _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::~_Tuple_impl((_Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    *)(local_208 + 0x10));
  }
  else {
    local_2a0 = (mapped_type *)comment;
    sVar3 = std::
            set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
            ::count(&this->execution_models_,&execution_model_local);
    if (sVar3 != 0) {
      local_290 = &this->function_id_;
      local_298 = AssemblyGrammar::lookupOperandName
                            (&this->_->grammar_,SPV_OPERAND_TYPE_EXECUTION_MODEL,
                             execution_model_local);
      pVVar2 = this->_;
      operand = Decoration::builtin(decoration);
      pcVar4 = AssemblyGrammar::lookupOperandName
                         (&pVVar2->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand);
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      if (vuid < 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"",&local_2a5);
      }
      else {
        ValidationState_t::VkErrorID_abi_cxx11_(&local_288,this->_,vuid,(char *)0x0);
      }
      std::operator<<((ostream *)local_208,(string *)&local_288);
      std::operator<<((ostream *)local_208,(char *)local_2a0);
      std::operator<<((ostream *)local_208," ");
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                (&local_268,(_anonymous_namespace_ *)referenced_inst,inst);
      std::operator<<((ostream *)local_208,(string *)&local_268);
      std::operator<<((ostream *)local_208," depends on ");
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                (&local_228,(_anonymous_namespace_ *)built_in_inst,inst_00);
      std::operator<<((ostream *)local_208,(string *)&local_228);
      std::operator<<((ostream *)local_208," which is decorated with BuiltIn ");
      std::operator<<((ostream *)local_208,pcVar4);
      std::operator<<((ostream *)local_208,".");
      std::operator<<((ostream *)local_208," Id <");
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::operator<<((ostream *)local_208,"> is later referenced by ");
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                (&local_248,(_anonymous_namespace_ *)referenced_from_inst,inst_01);
      std::operator<<((ostream *)local_208,(string *)&local_248);
      std::operator<<((ostream *)local_208," in function <");
      pDVar5 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,local_290);
      std::operator<<((ostream *)pDVar5,"> which is called with execution model ");
      std::operator<<((ostream *)pDVar5,local_298);
      std::operator<<((ostream *)pDVar5,".");
      sVar1 = pDVar5->error_;
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return sVar1;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateNotCalledWithExecutionModel(
    int vuid, const char* comment, spv::ExecutionModel execution_model,
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (function_id_) {
    if (execution_models_.count(execution_model)) {
      const char* execution_model_str = _.grammar().lookupOperandName(
          SPV_OPERAND_TYPE_EXECUTION_MODEL, uint32_t(execution_model));
      const char* built_in_str = _.grammar().lookupOperandName(
          SPV_OPERAND_TYPE_BUILT_IN, (uint32_t)decoration.builtin());
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << (vuid < 0 ? std::string("") : _.VkErrorID(vuid)) << comment
             << " " << GetIdDesc(referenced_inst) << " depends on "
             << GetIdDesc(built_in_inst) << " which is decorated with BuiltIn "
             << built_in_str << "."
             << " Id <" << referenced_inst.id() << "> is later referenced by "
             << GetIdDesc(referenced_from_inst) << " in function <"
             << function_id_ << "> which is called with execution model "
             << execution_model_str << ".";
    }
  } else {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateNotCalledWithExecutionModel, this,
                  vuid, comment, execution_model, decoration, built_in_inst,
                  referenced_from_inst, std::placeholders::_1));
  }
  return SPV_SUCCESS;
}